

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O2

Node * __thiscall RootWindow::build(RootWindow *this)

{
  GlyphContext *this_00;
  ostream *poVar1;
  Node *this_01;
  OpacityNode *pOVar2;
  LayoutNode *pLVar3;
  Example *pEVar4;
  SignalHandler_Function<> *this_02;
  Button *this_03;
  float extraout_XMM0_Da;
  float fVar5;
  float extraout_XMM0_Db;
  rect2d rect;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  float local_78;
  string local_68;
  float local_48;
  Units local_34 [2];
  Units units;
  
  this_00 = (GlyphContext *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_68,"OpenSans-Regular.ttf",(allocator *)local_34);
  rengine::GlyphContext::GlyphContext(this_00,&local_68);
  this->m_font = this_00;
  std::__cxx11::string::~string((string *)&local_68);
  if (this->m_font->m_fontData == (uchar *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Failed to load \'");
    poVar1 = std::operator<<(poVar1,"OpenSans-Regular.ttf");
    poVar1 = std::operator<<(poVar1,"\'...");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,
                             "The font file needs to be downloaded separately and placed next");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"to the \'demo\' binary.");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (this->m_font->m_fontData == (uchar *)0x0) {
      __assert_fail("m_font->isValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                    ,0x2f,"virtual Node *RootWindow::build()");
    }
  }
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[10])();
  local_48 = extraout_XMM0_Db;
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
  local_78 = extraout_XMM0_Da;
  this_01 = rengine::Node::create();
  pOVar2 = rengine::OpacityNode::create();
  this->m_appLayer = pOVar2;
  pLVar3 = rengine::LayoutNode::create();
  this->m_buttonGrid = pLVar3;
  rengine::LayoutNode::setActivationMode(pLVar3,Explicit);
  rengine::LayoutNode::setLayoutType(this->m_buttonGrid,Grid_Horizontal);
  pLVar3 = this->m_buttonGrid;
  fVar5 = local_48 / 25.4 + local_48 / 25.4;
  if (fVar5 <= 10.0) {
    fVar5 = 10.0;
  }
  local_48 = roundf(fVar5);
  rengine::LayoutNode::setCellWidth(pLVar3,local_48 * 15.0);
  rengine::LayoutNode::setCellHeight(this->m_buttonGrid,local_48 * 3.0);
  rengine::LayoutNode::setSpacing(this->m_buttonGrid,local_48);
  rengine::LayoutNode::setMargin(this->m_buttonGrid,local_48);
  rengine::LayoutNode::setColumnCount(this->m_buttonGrid,1);
  rengine::LayoutNode::setX
            (this->m_buttonGrid,local_78 * 0.5 - *(float *)&this->m_buttonGrid->field_0x4c * 0.5);
  pEVar4 = (Example *)operator_new(0x58);
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar4->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar4->super_Node).m_parent = (Node *)0x0;
  (pEVar4->super_Node).m_child = (Node *)0x0;
  (pEVar4->super_Node).m_next = (Node *)0x0;
  (pEVar4->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar4->super_Node).field_0x30 = 0;
  pEVar4->m_window = (RootWindow *)0x0;
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__Rectangles_00147840;
  pEVar4[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar4[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar4[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar4,local_34);
  pEVar4 = (Example *)operator_new(0x50);
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar4->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar4->super_Node).m_parent = (Node *)0x0;
  (pEVar4->super_Node).m_child = (Node *)0x0;
  (pEVar4->super_Node).m_next = (Node *)0x0;
  (pEVar4->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar4->super_Node).field_0x30 = 0;
  pEVar4->m_window = (RootWindow *)0x0;
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__LayeredOpacity_001478c0;
  pEVar4[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar4[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  add(this,pEVar4,local_34);
  pEVar4 = (Example *)operator_new(0x58);
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar4->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar4->super_Node).m_parent = (Node *)0x0;
  (pEVar4->super_Node).m_child = (Node *)0x0;
  (pEVar4->super_Node).m_next = (Node *)0x0;
  (pEVar4->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar4->super_Node).field_0x30 = 0;
  pEVar4->m_window = (RootWindow *)0x0;
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__BlurExample_00147928;
  pEVar4[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar4[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar4[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar4,local_34);
  pEVar4 = (Example *)operator_new(0x58);
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar4->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar4->super_Node).m_parent = (Node *)0x0;
  (pEVar4->super_Node).m_child = (Node *)0x0;
  (pEVar4->super_Node).m_next = (Node *)0x0;
  (pEVar4->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar4->super_Node).field_0x30 = 0;
  pEVar4->m_window = (RootWindow *)0x0;
  (pEVar4->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__ShadowExample_00147a70;
  pEVar4[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar4[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar4[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar4,local_34);
  rengine::LayoutNode::updateLayout(this->m_buttonGrid);
  rengine::Node::append(this_01,&this->m_buttonGrid->super_Node);
  rengine::Node::append(this_01,&this->m_appLayer->super_Node);
  this_02 = (SignalHandler_Function<> *)operator_new(0x28);
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  rengine::SignalHandler_Function<>::SignalHandler_Function(this_02,(function<void_()> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_68._M_dataplus._M_p = (pointer)this_02;
  std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>::
  emplace_back<rengine::SignalHandler<>*>
            ((vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>> *)
             &this->m_buttonSignalHandlers,(SignalHandler<> **)&local_68);
  this_03 = createTextButton(this,"Close",local_34);
  this->m_closeButton = this_03;
  pLVar3 = this->m_buttonGrid;
  fVar5 = *(float *)&(pLVar3->super_Node).field_0x34;
  rect.br.x = *(float *)&pLVar3->field_0x4c + fVar5;
  rect.br.y = *(float *)&pLVar3->field_0x50 + fVar5;
  rect.tl.y = fVar5;
  rect.tl.x = fVar5;
  rengine::RectangleNodeBase::setGeometry(&this_03->super_RectangleNodeBase,rect);
  rengine::Signal<>::connect
            (&Button::onClicked,(int)this->m_closeButton,(sockaddr *)this_02,(socklen_t)pLVar3);
  return this_01;
}

Assistant:

Node *RootWindow::build()
{
    const char *fontFile = "OpenSans-Regular.ttf";
    m_font = new GlyphContext(fontFile);
    if (!m_font->isValid()) {
        cerr << "Failed to load '" << fontFile << "'..." << endl
             << "The font file needs to be downloaded separately and placed next" << endl
             << "to the 'demo' binary." << endl;
    }
    assert(m_font->isValid());

    Units units(this);
    vec2 windowSize = size();

    Node *root = Node::create();

    // Prepare the app layer
    m_appLayer = OpacityNode::create();


    // Prepare the button grid
    m_buttonGrid = LayoutNode::create();
    m_buttonGrid->setActivationMode(LayoutNode::Explicit);
    m_buttonGrid->setLayoutType(LayoutEngine::Grid_Horizontal);
    m_buttonGrid->setCellWidth(units.base() * 15.0f);
    m_buttonGrid->setCellHeight(units.base() * 3.0f);
    m_buttonGrid->setSpacing(units.base() * 1.0f);
    m_buttonGrid->setMargin(units.base() * 1.0f);
    m_buttonGrid->setColumnCount(1);
    m_buttonGrid->setX(windowSize.x / 2 - m_buttonGrid->cellWidth() / 2);

    add(new Rectangles(), units);
    add(new LayeredOpacity(), units);
    add(new BlurExample(), units);
    add(new ShadowExample(), units);

    m_buttonGrid->updateLayout();

    root->append(m_buttonGrid);
    root->append(m_appLayer);

    // The close button..
    SignalHandler_Function<> *handler = new SignalHandler_Function<>([this] () { closeExample(); });
    m_buttonSignalHandlers.push_back(handler);
    m_closeButton = createTextButton("Close", units);
    m_closeButton->setGeometry(rect2d::fromXywh(m_buttonGrid->margin(), m_buttonGrid->margin(),
                                                m_buttonGrid->cellWidth(), m_buttonGrid->cellHeight()));

    Button::onClicked.connect(m_closeButton, handler);

    return root;
}